

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# khash_str2int.h
# Opt level: O2

int khash_str2int_set(void *_hash,char *str,int value)

{
  khint_t in_EAX;
  kh_str2int_t *hash;
  int ret;
  int local_14;
  
  if (_hash != (void *)0x0) {
    in_EAX = kh_put_str2int((kh_str2int_t *)_hash,str,&local_14);
    *(int *)(*(long *)((long)_hash + 0x20) + (ulong)in_EAX * 4) = value;
  }
  return in_EAX;
}

Assistant:

static inline int khash_str2int_set(void *_hash, const char *str, int value)
{
    khint_t k;
    int ret;
    khash_t(str2int) *hash = (khash_t(str2int)*)_hash;
    if ( !hash ) return -1;
    k = kh_put(str2int, hash, str, &ret);
    kh_val(hash,k) = value;
    return k;
}